

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O1

int secp256k1_ge_x_on_curve_var(secp256k1_fe *x)

{
  int iVar1;
  secp256k1_fe c;
  secp256k1_fe local_40;
  
  secp256k1_fe_sqr(&local_40,x);
  secp256k1_fe_mul(&local_40,&local_40,x);
  secp256k1_fe_verify(&local_40);
  local_40.n[0] = local_40.n[0] + 7;
  local_40.magnitude = local_40.magnitude + 1;
  local_40.normalized = 0;
  secp256k1_fe_verify(&local_40);
  iVar1 = secp256k1_fe_is_square_var(&local_40);
  return iVar1;
}

Assistant:

static int secp256k1_ge_x_on_curve_var(const secp256k1_fe *x) {
    secp256k1_fe c;
    secp256k1_fe_sqr(&c, x);
    secp256k1_fe_mul(&c, &c, x);
    secp256k1_fe_add_int(&c, SECP256K1_B);
    return secp256k1_fe_is_square_var(&c);
}